

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O1

bool __thiscall cmParsePHPCoverage::ReadFileInformation(cmParsePHPCoverage *this,istream *in)

{
  cmCTest *pcVar1;
  bool bVar2;
  size_t sVar3;
  char *__s;
  long *plVar4;
  ostream *poVar5;
  bool bVar6;
  cmParsePHPCoverage *this_00;
  long lVar7;
  char c;
  char buf [4];
  string fileName;
  int size;
  ostringstream cmCTestLog_msg;
  char local_1f5;
  short local_1f4;
  undefined1 local_1f2;
  string local_1f0;
  char local_1d0;
  undefined7 uStack_1cf;
  long local_1c0 [2];
  int local_1ac;
  undefined1 local_1a8 [376];
  
  this_00 = (cmParsePHPCoverage *)in;
  std::istream::read((char *)in,(long)&local_1f4);
  local_1f2 = 0;
  if (local_1f4 != 0x3a73) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"failed to read start of file info found: [",0x2a);
    sVar3 = strlen((char *)&local_1f4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)&local_1f4,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]\n",2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x88,local_1f0._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return false;
  }
  local_1ac = 0;
  ReadInt(this_00,in,&local_1ac);
  lVar7 = (long)local_1ac;
  local_1ac = local_1ac + 1;
  __s = (char *)operator_new__(lVar7 + 2);
  plVar4 = (long *)std::istream::get((char *)in);
  if (((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) &&
     (local_1f5 != '\"')) {
    operator_delete__(__s);
    return false;
  }
  std::istream::read((char *)in,(long)__s);
  __s[lVar7] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,__s,__s + sVar3);
  operator_delete__(__s);
  plVar4 = (long *)std::istream::get((char *)in);
  if (((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) &&
     (local_1f5 != '\"')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"failed to read close quote\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"read [",6);
    local_1d0 = local_1f5;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x9e,(char *)CONCAT71(uStack_1cf,local_1d0),false);
  }
  else {
    bVar2 = ReadCoverageArray(this,in,&local_1f0);
    bVar6 = true;
    if (bVar2) goto LAB_0018893d;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"failed to read coverage array for file: ",0x28);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0xa4,(char *)CONCAT71(uStack_1cf,local_1d0),false);
  }
  if ((long *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
    operator_delete((long *)CONCAT71(uStack_1cf,local_1d0),local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  bVar6 = false;
LAB_0018893d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    return bVar6;
  }
  return bVar6;
}

Assistant:

bool cmParsePHPCoverage::ReadFileInformation(std::istream& in)
{
  char buf[4];
  in.read(buf, 2);
  buf[2] = 0;
  if (strcmp(buf, "s:") != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read start of file info found: [" << buf << "]\n");
    return false;
  }
  char c;
  int size = 0;
  if (this->ReadInt(in, size)) {
    size++; // add one for null termination
    char* s = new char[size + 1];
    // read open quote
    if (in.get(c) && c != '"') {
      delete[] s;
      return false;
    }
    // read the string data
    in.read(s, size - 1);
    s[size - 1] = 0;
    std::string fileName = s;
    delete[] s;
    // read close quote
    if (in.get(c) && c != '"') {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read close quote\n"
                   << "read [" << c << "]\n");
      return false;
    }
    if (!this->ReadCoverageArray(in, fileName)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read coverage array for file: " << fileName
                                                            << "\n");
      return false;
    }
    return true;
  }
  return false;
}